

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampleMOD.cpp
# Opt level: O3

void __thiscall WDL_Resampler::SetRates(WDL_Resampler *this,int rate_in,int rate_out)

{
  int iVar1;
  Fraction FVar2;
  
  if (rate_in < 2) {
    rate_in = 1;
  }
  iVar1 = 1;
  if (1 < rate_out) {
    iVar1 = rate_out;
  }
  if (((this->m_ratio).num == rate_in) && ((this->m_ratio).den == iVar1)) {
    return;
  }
  FVar2.den = iVar1;
  FVar2.num = rate_in;
  this->m_ratio = FVar2;
  this->m_sinc_ideal_calced = -1;
  return;
}

Assistant:

void WDL_Resampler::SetRates(double rate_in, double rate_out) 
#endif
{
  if (rate_in<1) rate_in=1;
  if (rate_out<1) rate_out=1;
#ifdef WDL_RESAMPLE_RATIONAL
  if (m_ratio != Fraction(rate_in, rate_out))
  {
    m_ratio=Fraction(rate_in, rate_out);
    m_sinc_ideal_calced = -1;
  }
#else
  if (rate_in != m_sratein || rate_out != m_srateout)
  {
    m_sratein=rate_in; 
    m_srateout=rate_out;  
    m_ratio=m_sratein / m_srateout;
    m_sinc_ideal_calced = -1;
  }
#endif
}